

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::JsonUnitTestResultPrinter::JsonUnitTestResultPrinter
          (JsonUnitTestResultPrinter *this,char *output_file)

{
  allocator<char> local_15;
  GTestLog local_14;
  
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__JsonUnitTestResultPrinter_00145048;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->output_file_,output_file,&local_15);
  if ((this->output_file_)._M_string_length == 0) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O2/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0x11a7);
    std::operator<<((ostream *)&std::cerr,"JSON output file may not be null");
    GTestLog::~GTestLog(&local_14);
  }
  return;
}

Assistant:

JsonUnitTestResultPrinter::JsonUnitTestResultPrinter(const char* output_file)
    : output_file_(output_file) {
  if (output_file_.empty()) {
    GTEST_LOG_(FATAL) << "JSON output file may not be null";
  }
}